

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O1

SBuf * lj_buf_putstr_rep(SBuf *sb,GCstr *s,int32_t rep)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  GCstr *pGVar4;
  GCstr *pGVar5;
  ulong uVar6;
  char *__s;
  GCstr *pGVar7;
  
  uVar1 = s->len;
  if (uVar1 == 0 || rep < 1) {
    return sb;
  }
  uVar6 = (ulong)(uint)rep * (ulong)uVar1;
  if (uVar6 < 0x7fffff01) {
    __s = sb->w;
    if ((uint)uVar6 <= (uint)(*(int *)&sb->e - (int)__s)) goto LAB_00110be8;
  }
  else {
    lj_buf_putstr_rep_cold_1();
  }
  __s = lj_buf_more2(sb,(MSize)uVar6);
LAB_00110be8:
  pGVar7 = s + 1;
  if (uVar1 == 1) {
    iVar3 = 1;
    if (rep < 1) {
      iVar3 = rep;
    }
    memset(__s,(uint)(byte)(pGVar7->nextgc).gcptr64,(ulong)(uint)(rep - iVar3) + 1);
    __s = __s + (ulong)(uint)(rep - iVar3) + 1;
  }
  else {
    pGVar4 = pGVar7;
    do {
      do {
        pGVar5 = (GCstr *)((long)&(pGVar4->nextgc).gcptr64 + 1);
        *__s = (char)(pGVar4->nextgc).gcptr64;
        __s = __s + 1;
        pGVar4 = pGVar5;
      } while (pGVar5 < (GCstr *)((long)&(pGVar7->nextgc).gcptr64 + (ulong)uVar1));
      bVar2 = 1 < rep;
      pGVar4 = pGVar7;
      rep = rep + -1;
    } while (bVar2);
  }
  sb->w = __s;
  return sb;
}

Assistant:

SBuf *lj_buf_putstr_rep(SBuf *sb, GCstr *s, int32_t rep)
{
  MSize len = s->len;
  if (rep > 0 && len) {
    uint64_t tlen = (uint64_t)rep * len;
    char *w;
    if (LJ_UNLIKELY(tlen > LJ_MAX_STR))
      lj_err_mem(sbufL(sb));
    w = lj_buf_more(sb, (MSize)tlen);
    if (len == 1) {  /* Optimize a common case. */
      uint32_t c = strdata(s)[0];
      do { *w++ = c; } while (--rep > 0);
    } else {
      const char *e = strdata(s) + len;
      do {
	const char *q = strdata(s);
	do { *w++ = *q++; } while (q < e);
      } while (--rep > 0);
    }
    sb->w = w;
  }
  return sb;
}